

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  pointer piVar1;
  pointer piVar2;
  int *piVar3;
  iterator iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int n;
  int r;
  int d;
  int temp;
  vector<int,_std::allocator<int>_> morning;
  vector<int,_std::allocator<int>_> evening;
  uint local_78;
  int local_74;
  int local_70;
  int local_6c;
  vector<int,_std::allocator<int>_> local_68;
  int *local_48;
  iterator iStack_40;
  int *local_38;
  
  iVar5 = __isoc99_scanf("%d %d %d",&local_78,&local_70,&local_74);
  if ((((iVar5 != 0) && (local_78 != 0)) && (local_70 != 0)) && (local_74 != 0)) {
    do {
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      std::vector<int,_std::allocator<int>_>::reserve(&local_68,(ulong)local_78);
      if (0 < (int)local_78) {
        iVar5 = 0;
        do {
          __isoc99_scanf("%d",&local_6c);
          if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_68,
                       (iterator)
                       local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_6c);
          }
          else {
            *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_6c;
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < (int)local_78);
      }
      local_48 = (int *)0x0;
      iStack_40._M_current = (int *)0x0;
      local_38 = (int *)0x0;
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)&local_48,(long)(int)local_78);
      if (0 < (int)local_78) {
        iVar5 = 0;
        do {
          __isoc99_scanf("%d",&local_6c);
          if (iStack_40._M_current == local_38) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_48,iStack_40,&local_6c);
          }
          else {
            *iStack_40._M_current = local_6c;
            iStack_40._M_current = iStack_40._M_current + 1;
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < (int)local_78);
      }
      piVar2 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar1 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        uVar6 = (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        lVar7 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (piVar1,piVar2);
      }
      iVar4._M_current = iStack_40._M_current;
      piVar3 = local_48;
      if (local_48 != iStack_40._M_current) {
        uVar6 = (long)iStack_40._M_current - (long)local_48 >> 2;
        lVar7 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                  (local_48,iStack_40._M_current,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                  (piVar3,iVar4._M_current);
      }
      if ((long)(int)local_78 < 1) {
        iVar5 = 0;
      }
      else {
        lVar7 = 0;
        iVar5 = 0;
        do {
          iVar8 = (local_48[lVar7] +
                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7]) - local_70;
          if (iVar8 == 0 ||
              local_48[lVar7] +
              local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar7] < local_70) {
            iVar8 = 0;
          }
          iVar5 = iVar5 + iVar8;
          lVar7 = lVar7 + 1;
        } while ((int)local_78 != lVar7);
      }
      printf("%d\n",(ulong)(uint)(iVar5 * local_74));
      if (local_48 != (int *)0x0) {
        operator_delete(local_48,(long)local_38 - (long)local_48);
      }
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar5 = __isoc99_scanf("%d %d %d",&local_78,&local_70,&local_74);
    } while (((iVar5 != 0) && (local_78 != 0)) && ((local_70 != 0 && (local_74 != 0))));
  }
  return 0;
}

Assistant:

int main(){
    int n,d,r,temp;
    while (scanf("%d %d %d", &n, &d, &r) && n && d && r){
        vector<int> morning;
        morning.reserve(static_cast<unsigned int>(n));

        for (int i = 0; i < n; ++i) {
            scanf("%d",&temp);
            morning.push_back(temp);
        }
        vector<int> evening;
        evening.reserve(n);
        for (int j = 0; j < n; ++j) {
            scanf("%d",&temp);
            evening.push_back(temp);
        }

        sort(morning.begin(),morning.end());
        sort(evening.begin(),evening.end(), greater<>());
        int totalCost = 0;
        for (int k = 0; k < n; ++k) {
            int cost = morning[k] + evening[k];
            if (cost > d){
                totalCost += cost-d;
            }
        }
        totalCost *= r;
        printf("%d\n",totalCost);

    }
    return 0;
}